

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

uint log_var_update_state(log_var_t *log_var)

{
  char cVar1;
  char *__s;
  int iVar2;
  uint uVar3;
  size_t __n;
  char *__s1;
  size_t __n_00;
  ptrdiff_t log_var_len;
  
  __s = log_var->name;
  __n = strlen(__s);
  uVar3 = 1;
  if ((log_init_done.repr & 1U) != 0) {
    __s1 = log_var_names;
    do {
      for (__n_00 = 0; (cVar1 = __s1[__n_00], cVar1 != '\0' && (cVar1 != '|')); __n_00 = __n_00 + 1)
      {
      }
      if ((__n_00 == 1) && (*__s1 == '.')) {
LAB_001389fc:
        uVar3 = 2;
        goto LAB_00138a01;
      }
      if (__n == __n_00) {
        iVar2 = strncmp(__s1,__s,__n);
        if (iVar2 == 0) goto LAB_001389fc;
      }
      else if ((((long)__n_00 < (long)__n) && (iVar2 = strncmp(__s1,__s,__n_00), iVar2 == 0)) &&
              (__s[__n_00] == '.')) goto LAB_001389fc;
      __s1 = __s1 + __n_00 + 1;
    } while (cVar1 != '\0');
    uVar3 = 1;
LAB_00138a01:
    (log_var->state).repr = uVar3;
  }
  return uVar3;
}

Assistant:

unsigned
log_var_update_state(log_var_t *log_var) {
	const char *log_var_begin = log_var->name;
	const char *log_var_end = log_var->name + strlen(log_var->name);

	/* Pointer to one before the beginning of the current segment. */
	const char *segment_begin = log_var_names;

	/*
	 * If log_init done is false, we haven't parsed the malloc conf yet.  To
	 * avoid log-spew, we default to not displaying anything.
	 */
	if (!atomic_load_b(&log_init_done, ATOMIC_ACQUIRE)) {
		return LOG_INITIALIZED_NOT_ENABLED;
	}

	while (true) {
		const char *segment_end = log_var_extract_segment(
		    segment_begin);
		assert(segment_end < log_var_names + JEMALLOC_LOG_VAR_BUFSIZE);
		if (log_var_matches_segment(segment_begin, segment_end,
		    log_var_begin, log_var_end)) {
			atomic_store_u(&log_var->state, LOG_ENABLED,
			    ATOMIC_RELAXED);
			return LOG_ENABLED;
		}
		if (*segment_end == '\0') {
			/* Hit the end of the segment string with no match. */
			atomic_store_u(&log_var->state,
			    LOG_INITIALIZED_NOT_ENABLED, ATOMIC_RELAXED);
			return LOG_INITIALIZED_NOT_ENABLED;
		}
		/* Otherwise, skip the delimiter and continue. */
		segment_begin = segment_end + 1;
	}
}